

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.cpp
# Opt level: O1

ScalarFunctionSet * duckdb::BitwiseXorFun::GetFunctions(void)

{
  LogicalTypeId LVar1;
  pointer pSVar2;
  LogicalType varargs;
  LogicalType varargs_00;
  NotImplementedException *this;
  ScalarFunction *function;
  long lVar3;
  pointer function_00;
  ScalarFunctionSet *in_RDI;
  pointer other;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  undefined4 in_stack_fffffffffffffb54;
  undefined4 in_stack_fffffffffffffb5c;
  FunctionNullHandling in_stack_fffffffffffffb68;
  allocator_type local_491;
  code *in_stack_fffffffffffffb70;
  scalar_function_t local_468;
  LogicalType local_448 [2];
  _Any_data local_418;
  code *local_408;
  undefined8 uStack_400;
  _func_int **local_3f0;
  vector<duckdb::ScalarFunction,_true> *local_3e8;
  LogicalType *local_3e0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3d8;
  LogicalType local_3c0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3a8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_390;
  LogicalType local_378;
  LogicalType local_360;
  LogicalType local_348;
  ScalarFunction local_330;
  ScalarFunction local_208;
  BaseScalarFunction local_e0;
  
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  LogicalType::Integral();
  local_3e0 = local_3d8.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish;
  if (local_3d8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_3d8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_3e8 = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
    local_3f0 = (_func_int **)&PTR__ScalarFunction_01998f18;
    other = local_3d8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            _M_impl.super__Vector_impl_data._M_start;
    do {
      LogicalType::LogicalType(local_448,other);
      LogicalType::LogicalType(local_448 + 1,other);
      __l._M_len = 2;
      __l._M_array = local_448;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_390,__l,&local_491);
      LogicalType::LogicalType(&local_348,other);
      local_408 = (code *)0x0;
      uStack_400 = 0;
      local_418._M_unused._M_object = (void *)0x0;
      local_418._8_8_ = 0;
      LVar1 = other->id_;
      if (LVar1 < UTINYINT) {
        switch(LVar1) {
        case TINYINT:
          in_stack_fffffffffffffb70 =
               ScalarFunction::
               BinaryFunction<signed_char,signed_char,signed_char,duckdb::BitwiseXOROperator>;
          break;
        case SMALLINT:
          in_stack_fffffffffffffb70 =
               ScalarFunction::BinaryFunction<short,short,short,duckdb::BitwiseXOROperator>;
          break;
        case INTEGER:
          in_stack_fffffffffffffb70 =
               ScalarFunction::BinaryFunction<int,int,int,duckdb::BitwiseXOROperator>;
          break;
        case BIGINT:
          in_stack_fffffffffffffb70 =
               ScalarFunction::BinaryFunction<long,long,long,duckdb::BitwiseXOROperator>;
          break;
        default:
switchD_0101f610_default:
          this = (NotImplementedException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&stack0xfffffffffffffb70,
                     "Unimplemented type for GetScalarIntegerBinaryFunction","");
          NotImplementedException::NotImplementedException(this,(string *)&stack0xfffffffffffffb70);
          __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      else {
        switch(LVar1) {
        case UTINYINT:
          in_stack_fffffffffffffb70 =
               ScalarFunction::
               BinaryFunction<unsigned_char,unsigned_char,unsigned_char,duckdb::BitwiseXOROperator>;
          break;
        case USMALLINT:
          in_stack_fffffffffffffb70 =
               ScalarFunction::
               BinaryFunction<unsigned_short,unsigned_short,unsigned_short,duckdb::BitwiseXOROperator>
          ;
          break;
        case UINTEGER:
          in_stack_fffffffffffffb70 =
               ScalarFunction::
               BinaryFunction<unsigned_int,unsigned_int,unsigned_int,duckdb::BitwiseXOROperator>;
          break;
        case UBIGINT:
          in_stack_fffffffffffffb70 =
               ScalarFunction::
               BinaryFunction<unsigned_long,unsigned_long,unsigned_long,duckdb::BitwiseXOROperator>;
          break;
        default:
          if (LVar1 == UHUGEINT) {
            in_stack_fffffffffffffb70 =
                 ScalarFunction::
                 BinaryFunction<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BitwiseXOROperator>
            ;
          }
          else {
            if (LVar1 != HUGEINT) goto switchD_0101f610_default;
            in_stack_fffffffffffffb70 =
                 ScalarFunction::
                 BinaryFunction<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::BitwiseXOROperator>
            ;
          }
        }
      }
      ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
                ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                 local_418._M_pod_data,
                 (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)
                 &stack0xfffffffffffffb70);
      LogicalType::LogicalType(&local_360,INVALID);
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      varargs._0_8_ = &local_360;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           in_stack_fffffffffffffb54;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = in_stack_fffffffffffffb5c;
      ScalarFunction::ScalarFunction
                (&local_208,(vector<duckdb::LogicalType,_true> *)&local_390,&local_348,
                 (scalar_function_t *)&local_418,(bind_scalar_function_t)0x0,
                 (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                 (init_local_state_t)0x0,varargs,CONSISTENT,in_stack_fffffffffffffb68,
                 in_stack_fffffffffffffb70);
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>
                (&local_3e8->
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                 &local_208);
      local_208.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           local_3f0;
      if (local_208.function_info.internal.
          super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_208.function_info.internal.
                   super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_208.function.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_208.function.super__Function_base._M_manager)
                  ((_Any_data *)&local_208.function,(_Any_data *)&local_208.function,
                   __destroy_functor);
      }
      BaseScalarFunction::~BaseScalarFunction(&local_208.super_BaseScalarFunction);
      LogicalType::~LogicalType(&local_360);
      if (local_408 != (code *)0x0) {
        (*local_408)(&local_418,&local_418,__destroy_functor);
      }
      LogicalType::~LogicalType(&local_348);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_390);
      lVar3 = 0x18;
      do {
        LogicalType::~LogicalType((LogicalType *)(&local_448[0].id_ + lVar3));
        lVar3 = lVar3 + -0x18;
      } while (lVar3 != -0x18);
      other = other + 1;
    } while (other != local_3e0);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3d8);
  LogicalType::LogicalType(local_448,BIT);
  LogicalType::LogicalType(local_448 + 1,BIT);
  __l_00._M_len = 2;
  __l_00._M_array = local_448;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_3a8,__l_00,(allocator_type *)&stack0xfffffffffffffb70);
  LogicalType::LogicalType(&local_3c0,BIT);
  local_468.super__Function_base._M_functor._8_8_ = 0;
  local_468.super__Function_base._M_functor._M_unused._M_object = BitwiseXOROperation;
  local_468._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_468.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_378,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_00._0_8_ = &local_378;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffffb54;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffffb5c;
  ScalarFunction::ScalarFunction
            (&local_330,(vector<duckdb::LogicalType,_true> *)&local_3a8,&local_3c0,&local_468,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_00,CONSISTENT,
             in_stack_fffffffffffffb68,in_stack_fffffffffffffb70);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
              super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_330);
  local_330.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01998f18;
  if (local_330.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_330.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_330.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_330.function.super__Function_base._M_manager)
              ((_Any_data *)&local_330.function,(_Any_data *)&local_330.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_330.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_378);
  if (local_468.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_468.super__Function_base._M_manager)
              ((_Any_data *)&local_468,(_Any_data *)&local_468,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_3c0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3a8);
  lVar3 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_448[0].id_ + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  function_00 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
                super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
                super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
                _M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (function_00 != pSVar2) {
    do {
      BaseScalarFunction::SetReturnsError(&local_e0,&function_00->super_BaseScalarFunction);
      BaseScalarFunction::~BaseScalarFunction(&local_e0);
      function_00 = function_00 + 1;
    } while (function_00 != pSVar2);
  }
  return in_RDI;
}

Assistant:

ScalarFunctionSet BitwiseXorFun::GetFunctions() {
	ScalarFunctionSet functions;
	for (auto &type : LogicalType::Integral()) {
		functions.AddFunction(
		    ScalarFunction({type, type}, type, GetScalarIntegerBinaryFunction<BitwiseXOROperator>(type)));
	}
	functions.AddFunction(ScalarFunction({LogicalType::BIT, LogicalType::BIT}, LogicalType::BIT, BitwiseXOROperation));
	for (auto &function : functions.functions) {
		BaseScalarFunction::SetReturnsError(function);
	}
	return functions;
}